

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall
I2sAnalyzer::AnalyzeSubFrame(I2sAnalyzer *this,U32 starting_index,U32 num_bits,U32 subframe_index)

{
  element_type *peVar1;
  reference pvVar2;
  reference pvVar3;
  element_type *peVar4;
  S64 adjusted_value;
  FrameV2 frame_v2;
  value_type vStack_78;
  U32 channel_1_polarity;
  Frame frame;
  uint local_4c;
  ulong uStack_48;
  U32 i_1;
  U64 bit_value_1;
  ulong uStack_38;
  U32 i;
  U64 bit_value;
  ulong uStack_28;
  U32 target_count;
  U64 result;
  U32 subframe_index_local;
  U32 num_bits_local;
  U32 starting_index_local;
  I2sAnalyzer *this_local;
  
  uStack_28 = 0;
  peVar1 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mShiftOrder == LsbFirst) {
    uStack_38 = 1;
    for (bit_value_1._4_4_ = starting_index; bit_value_1._4_4_ < starting_index + num_bits;
        bit_value_1._4_4_ = bit_value_1._4_4_ + 1) {
      pvVar2 = std::vector<BitState,_std::allocator<BitState>_>::operator[]
                         (&this->mDataBits,(ulong)bit_value_1._4_4_);
      if (*pvVar2 == BIT_HIGH) {
        uStack_28 = uStack_38 | uStack_28;
      }
      uStack_38 = uStack_38 << 1;
    }
  }
  else {
    uStack_48 = 1L << ((char)num_bits - 1U & 0x3f);
    for (local_4c = starting_index; local_4c < starting_index + num_bits; local_4c = local_4c + 1) {
      pvVar2 = std::vector<BitState,_std::allocator<BitState>_>::operator[]
                         (&this->mDataBits,(ulong)local_4c);
      if (*pvVar2 == BIT_HIGH) {
        uStack_28 = uStack_48 | uStack_28;
      }
      uStack_48 = uStack_48 >> 1;
    }
  }
  Frame::Frame((Frame *)&stack0xffffffffffffff88);
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&this->mDataValidEdges,(ulong)starting_index);
  vStack_78 = *pvVar3;
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&this->mDataValidEdges,(ulong)((starting_index - 1) + num_bits));
  _frame = *pvVar3;
  peVar4 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrame((Frame *)peVar4);
  FrameV2::FrameV2((FrameV2 *)&adjusted_value);
  FrameV2::AddInteger((char *)&adjusted_value,0x112196);
  peVar1 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mSigned == SignedInteger) {
    peVar1 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
    AnalyzerHelpers::ConvertToSignedNumber(uStack_28,peVar1->mBitsPerWord);
  }
  FrameV2::AddInteger((char *)&adjusted_value,0x112038);
  peVar4 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrameV2((FrameV2 *)peVar4,(char *)&adjusted_value,0x112038,vStack_78);
  FrameV2::~FrameV2((FrameV2 *)&adjusted_value);
  Frame::~Frame((Frame *)&stack0xffffffffffffff88);
  return;
}

Assistant:

void I2sAnalyzer::AnalyzeSubFrame( U32 starting_index, U32 num_bits, U32 subframe_index )
{
    U64 result = 0;
    U32 target_count = starting_index + num_bits;

    if( mSettings->mShiftOrder == AnalyzerEnums::LsbFirst )
    {
        U64 bit_value = 1ULL;
        for( U32 i = starting_index; i < target_count; i++ )
        {
            if( mDataBits[ i ] == BIT_HIGH )
                result |= bit_value;

            bit_value <<= 1;
        }
    }
    else
    {
        U64 bit_value = 1ULL << ( num_bits - 1 );
        for( U32 i = starting_index; i < target_count; i++ )
        {
            if( mDataBits[ i ] == BIT_HIGH )
                result |= bit_value;

            bit_value >>= 1;
        }
    }

    // enum I2sResultType { Channel1, Channel2, ErrorTooFewBits, ErrorDoesntDivideEvenly };
    // add result bubble
    Frame frame;
    frame.mData1 = result;


    U32 channel_1_polarity = 1;
    if( mSettings->mWordSelectInverted == WS_INVERTED )
        channel_1_polarity = 0;

    if( ( subframe_index & 0x1 ) == channel_1_polarity )
        frame.mType = U8( Channel1 );
    else
        frame.mType = U8( Channel2 );

    frame.mFlags = 0;
    frame.mStartingSampleInclusive = mDataValidEdges[ starting_index ];
    frame.mEndingSampleInclusive = mDataValidEdges[ starting_index + num_bits - 1 ];
    mResults->AddFrame( frame );
    FrameV2 frame_v2;
    frame_v2.AddInteger( "channel", frame.mType );
    S64 adjusted_value = result;
    if( mSettings->mSigned == AnalyzerEnums::SignedInteger )
    {
        adjusted_value = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
    }
    frame_v2.AddInteger( "data", adjusted_value );
    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
}